

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

int fy_document_set_anchor_internal(fy_document *fyd,fy_node *fyn,char *text,size_t len,uint flags)

{
  undefined1 *puVar1;
  byte bVar2;
  list_head *plVar3;
  int iVar4;
  fy_anchor *fya;
  char *pcVar5;
  fy_input *fyi;
  fy_token *anchor;
  fy_accel_entry *pfVar6;
  fy_document *fyd_00;
  size_t origlen;
  fy_atom handle;
  
  if (fyn == (fy_node *)0x0 || fyd == (fy_document *)0x0) {
    return -1;
  }
  if (fyn->fyd != fyd) {
    return -1;
  }
  if (len == 0xffffffffffffffff && text != (char *)0x0) {
    len = strlen(text);
  }
  fya = fy_document_lookup_anchor_by_node(fyd,fyn);
  if (text == (char *)0x0) {
    if (fya != (fy_anchor *)0x0) {
      return 0;
    }
    if (fyd->axl == (fy_accel *)0x0) {
      return 0;
    }
    if (fyd->naxl == (fy_accel *)0x0) {
      return 0;
    }
    pfVar6 = fy_accel_entry_lookup_key_value(fyd->axl,_DAT_00000018,(void *)0x0);
    fy_accel_entry_remove(fyd->axl,pfVar6);
    pfVar6 = fy_accel_entry_lookup_key_value(fyd->naxl,_DAT_00000010,(void *)0x0);
    fy_accel_entry_remove(fyd->naxl,pfVar6);
    return 0;
  }
  if (fya == (fy_anchor *)0x0) {
    if ((flags & 1) == 0) {
      fyi = fy_input_from_data(text,len,&handle,true);
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = (char *)malloc(len);
      if (pcVar5 == (char *)0x0) {
        fy_document_diag(fyd,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0xb3,"fy_document_set_anchor_internal","malloc() failed");
        goto LAB_0011b4c7;
      }
      memcpy(pcVar5,text,len);
      fy_input_from_malloc_data(pcVar5,len,&handle,true);
      fyi = fy_input_from_malloc_data(text,len,&handle,true);
    }
    if (fyi == (fy_input *)0x0) {
      fya = (fy_anchor *)0x0;
      fy_document_diag(fyd,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0xc0,"fy_document_set_anchor_internal","fy_input_from_data() failed");
      iVar4 = -1;
      fyi = (fy_input *)0x0;
      anchor = (fy_token *)0x0;
      goto LAB_0011b5f7;
    }
    iVar4 = -1;
    if ((handle._54_1_ & 0x20) != 0) {
      fyd_00 = (fy_document *)0x13;
      anchor = fy_token_create(FYTT_ANCHOR,&handle);
      if (anchor == (fy_token *)0x0) {
        anchor = (fy_token *)0x0;
        pcVar5 = (char *)0x0;
        fya = (fy_anchor *)0x0;
        goto LAB_0011b5f7;
      }
      fya = fy_anchor_create(fyd_00,fyn,anchor);
      if (fya == (fy_anchor *)0x0) {
        fya = (fy_anchor *)0x0;
      }
      else {
        plVar3 = (fyd->anchors)._lh.next;
        plVar3->prev = &fya->node;
        (fya->node).next = plVar3;
        (fya->node).prev = &(fyd->anchors)._lh;
        (fyd->anchors)._lh.next = &fya->node;
        if (fyd->axl == (fy_accel *)0x0) goto LAB_0011b7c9;
        if (fyd->naxl != (fy_accel *)0x0) {
          pfVar6 = fy_accel_entry_lookup(fyd->axl,fya->anchor);
          if (pfVar6 != (fy_accel_entry *)0x0) {
            bVar2 = *(byte *)((long)pfVar6->value + 0x20);
            if ((bVar2 & 1) == 0) {
              *(byte *)((long)pfVar6->value + 0x20) = bVar2 | 1;
            }
            fya->field_0x20 = fya->field_0x20 | 1;
            fy_document_diag(fyd,2,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                             ,0xd9,"fy_document_set_anchor_internal",
                             "register anchor %.*s is multiple",len,text);
          }
          pfVar6 = fy_accel_entry_insert(fyd->axl,fya->anchor,fya);
          if (pfVar6 == (fy_accel_entry *)0x0) {
            fy_document_diag(fyd,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                             ,0xde,"fy_document_set_anchor_internal",
                             "fy_accel_entry_insert() fyd->axl failed");
            goto LAB_0011b7e0;
          }
          if (fyd->axl == (fy_accel *)0x0) goto LAB_0011b7c9;
        }
        if ((fyd->naxl == (fy_accel *)0x0) ||
           (iVar4 = fy_accel_insert(fyd->naxl,fyn,fya), iVar4 == 0)) {
LAB_0011b7c9:
          fy_input_unref(fyi);
          return 0;
        }
        fy_document_diag(fyd,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0xe4,"fy_document_set_anchor_internal",
                         "fy_accel_insert() fyd->naxl failed");
      }
LAB_0011b7e0:
      pcVar5 = (char *)0x0;
      goto LAB_0011b5f7;
    }
    fya = (fy_anchor *)0x0;
  }
  else {
    pcVar5 = fy_token_get_text(fya->anchor,&origlen);
    if (pcVar5 == (char *)0x0) {
      fyi = (fy_input *)0x0;
      fy_document_diag(fyd,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0xa5,"fy_document_set_anchor_internal","fy_token_get_text() failed");
    }
    else {
      handle.storage_hint = 0;
      handle.end_mark.input_pos = 0;
      handle.end_mark.line = 0;
      handle.end_mark.column = 0;
      handle.start_mark.input_pos = 0x400000004;
      handle.start_mark._8_8_ = fy_node_token(fyn);
      fy_document_diag_report
                (fyd,(fy_diag_report_ctx *)&handle,
                 "cannot set anchor %.*s (anchor %.*s already exists)",len & 0xffffffff,text,
                 (ulong)(uint)origlen,pcVar5);
LAB_0011b4c7:
      fya = (fy_anchor *)0x0;
      fyi = (fy_input *)0x0;
    }
  }
  iVar4 = -1;
  anchor = (fy_token *)0x0;
  pcVar5 = (char *)0x0;
LAB_0011b5f7:
  free(pcVar5);
  fy_anchor_destroy(fya);
  fy_token_unref(anchor);
  fy_input_unref(fyi);
  puVar1 = &fyd->diag->field_0x3c;
  *puVar1 = *puVar1 & 0xfe;
  return iVar4;
}

Assistant:

static int fy_document_set_anchor_internal(struct fy_document *fyd, struct fy_node *fyn, const char *text, size_t len,
                                           unsigned int flags) {
    const bool copy = !!(flags & FYDSAF_COPY);
    const bool malloced = !!(flags & FYDSAF_MALLOCED);
    struct fy_anchor *fya = NULL, *fyam = NULL;
    struct fy_input *fyi = NULL;
    struct fy_token *fyt = NULL;
    struct fy_accel_entry *xle;
    struct fy_atom handle;
    char *data_copy = NULL;
    const char *origtext;
    size_t origlen;
    int rc;

    if (!fyd || !fyn || fyn->fyd != fyd)
        return -1;

    if (text && len == (size_t) -1)
        len = strlen(text);

    fya = fy_document_lookup_anchor_by_node(fyd, fyn);

    if (!text) {
        /* no anchor, and trying to delete? OK */
        if (fya)
            return 0;
        /* remove the anchor */
        fy_anchor_list_del(&fyd->anchors, fya);

        if (fy_document_is_accelerated(fyd)) {
            xle = fy_accel_entry_lookup_key_value(fyd->axl, fya->anchor, fya);
            fy_accel_entry_remove(fyd->axl, xle);

            xle = fy_accel_entry_lookup_key_value(fyd->naxl, fya->fyn, fya);
            fy_accel_entry_remove(fyd->naxl, xle);
        }

        fy_anchor_destroy(fya);
        return 0;
    }

    /* trying to add duplicate anchor */
    if (fya) {
        origtext = fy_token_get_text(fya->anchor, &origlen);
        fyd_error_check(fyd, origtext, err_out,
                        "fy_token_get_text() failed");

        FYD_NODE_ERROR(fyd, fyn, FYEM_DOC,
                       "cannot set anchor %.*s (anchor %.*s already exists)",
                       (int) len, text, (int) origlen, origtext);
        if (malloced && text)
            free((void *) text);
        fya = NULL;
        goto err_out;
    }

    if (copy) {
        data_copy = malloc(len);
        fyd_error_check(fyd, data_copy, err_out,
                        "malloc() failed");
        memcpy(data_copy, text, len);
        fyi = fy_input_from_malloc_data(data_copy, len, &handle, true);
    } else if (malloced)
        data_copy = (char *) text;
    else
        data_copy = NULL;

    if (data_copy)
        fyi = fy_input_from_malloc_data((void *) text, len, &handle, true);
    else
        fyi = fy_input_from_data(text, len, &handle, true);
    fyd_error_check(fyd, fyi, err_out,
                    "fy_input_from_data() failed");
    data_copy = NULL;

    /* it must not be something funky */
    if (!handle.valid_anchor)
        goto err_out;

    fyt = fy_token_create(FYTT_ANCHOR, &handle);
    if (!fyt)
        goto err_out;

    fya = fy_anchor_create(fyd, fyn, fyt);
    if (!fya)
        goto err_out;

    fy_anchor_list_add(&fyd->anchors, fya);
    if (fy_document_is_accelerated(fyd)) {
        xle = fy_accel_entry_lookup(fyd->axl, fya->anchor);
        if (xle) {
            fyam = (void *) xle->value;
            /* multiple */
            if (!fyam->multiple)
                fyam->multiple = true;
            fya->multiple = true;

            fyd_notice(fyd, "register anchor %.*s is multiple", (int) len, text);
        }

        xle = fy_accel_entry_insert(fyd->axl, fya->anchor, fya);
        fyd_error_check(fyd, xle, err_out,
                        "fy_accel_entry_insert() fyd->axl failed");
    }

    if (fy_document_is_accelerated(fyd)) {
        rc = fy_accel_insert(fyd->naxl, fyn, fya);
        fyd_error_check(fyd, !rc, err_out_rc,
                        "fy_accel_insert() fyd->naxl failed");
    }

    /* take away the input reference */
    fy_input_unref(fyi);

    return 0;
    err_out:
    rc = -1;
    err_out_rc:
    if (data_copy)
        free(data_copy);
    fy_anchor_destroy(fya);
    fy_token_unref(fyt);
    fy_input_unref(fyi);
    fyd->diag->on_error = false;
    return rc;
}